

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messages.pb.cc
# Opt level: O1

void __thiscall Messages::Person::Clear(Person *this)

{
  uint uVar1;
  string *psVar2;
  
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::RepeatedPtrField<Messages::Person_PhoneNumber>::TypeHandler>
            (&(this->phones_).super_RepeatedPtrFieldBase);
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((uVar1 & 3) != 0) {
    if ((uVar1 & 1) != 0) {
      psVar2 = (this->name_).ptr_;
      psVar2->_M_string_length = 0;
      *(psVar2->_M_dataplus)._M_p = '\0';
    }
    if ((uVar1 & 2) != 0) {
      psVar2 = (this->email_).ptr_;
      psVar2->_M_string_length = 0;
      *(psVar2->_M_dataplus)._M_p = '\0';
    }
  }
  this->id_ = 0;
  (this->_has_bits_).has_bits_[0] = 0;
  if ((this->field_0x8 & 1) == 0) {
    return;
  }
  google::protobuf::internal::InternalMetadata::DoClear<google::protobuf::UnknownFieldSet>
            ((InternalMetadata *)&this->field_0x8);
  return;
}

Assistant:

void Person::Clear() {
// @@protoc_insertion_point(message_clear_start:Messages.Person)
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  phones_.Clear();
  cached_has_bits = _has_bits_[0];
  if (cached_has_bits & 0x00000003u) {
    if (cached_has_bits & 0x00000001u) {
      name_.ClearNonDefaultToEmpty();
    }
    if (cached_has_bits & 0x00000002u) {
      email_.ClearNonDefaultToEmpty();
    }
  }
  id_ = 0;
  _has_bits_.Clear();
  _internal_metadata_.Clear<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>();
}